

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * fmt::v5::to_string<void*>(void **value)

{
  container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  buf;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  locale_ref loc;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_ffffffffffffffa0;
  
  loc.locale_ = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  internal::
  container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::container_buffer(in_RDI,in_stack_ffffffffffffff78);
  back_insert_range<fmt::v5::internal::basic_buffer<char>_>::back_insert_range
            ((back_insert_range<fmt::v5::internal::basic_buffer<char>_> *)
             in_stack_ffffffffffffff90.container,(basic_buffer<char> *)loc.locale_);
  internal::locale_ref::locale_ref((locale_ref *)&stack0xffffffffffffff90);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::basic_writer
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             in_RDI,(back_insert_range<fmt::v5::internal::basic_buffer<char>_>)
                    in_stack_ffffffffffffff90.container,loc);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write<void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  internal::
  container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~container_buffer((container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x19de52);
  return (string *)in_RDI;
}

Assistant:

std::string to_string(const T &value) {
  std::string str;
  internal::container_buffer<std::string> buf(str);
  writer(buf).write(value);
  return str;
}